

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void __thiscall ByteCodeGenerator::DefineFunctions(ByteCodeGenerator *this,FuncInfo *funcInfoParent)

{
  if ((funcInfoParent->field_0xb5 & 1) == 0) {
    DefineUncachedFunctions(this,funcInfoParent);
    return;
  }
  DefineCachedFunctions(this,funcInfoParent);
  return;
}

Assistant:

void ByteCodeGenerator::DefineFunctions(FuncInfo *funcInfoParent)
{
    // DefineCachedFunctions doesn't depend on whether the user vars are declared or not, so
    // we'll just overload this variable to mean that the functions getting called again and we don't need to do anything
    if (funcInfoParent->GetHasCachedScope())
    {
        this->DefineCachedFunctions(funcInfoParent);
    }
    else
    {
        this->DefineUncachedFunctions(funcInfoParent);
    }
}